

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O0

void Fxu_MatrixPrintDivisorProfile(FILE *pFile,Fxu_Matrix *p)

{
  int iVar1;
  void *__s;
  uint local_3c;
  uint local_38;
  int i;
  int CounterL;
  int Counter1;
  int *pProfile;
  Fxu_Double *pFStack_20;
  int WeightMax;
  Fxu_Double *pDiv;
  Fxu_Matrix *p_local;
  FILE *pFile_local;
  
  iVar1 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
  __s = malloc((long)(iVar1 + 1) << 2);
  memset(__s,0,(long)(iVar1 + 1) << 2);
  i = 0;
  local_38 = 0;
  local_3c = 0;
  do {
    if (p->nTableSize <= (int)local_3c) {
      fprintf((FILE *)pFile,"The double divisors profile:\n");
      fprintf((FILE *)pFile,"Weight  < -1 divisors = %6d\n",(ulong)local_38);
      fprintf((FILE *)pFile,"Weight    -1 divisors = %6d\n",(ulong)(uint)i);
      for (local_3c = 0; (int)local_3c <= iVar1; local_3c = local_3c + 1) {
        if (*(int *)((long)__s + (long)(int)local_3c * 4) != 0) {
          fprintf((FILE *)pFile,"Weight   %3d divisors = %6d\n",(ulong)local_3c,
                  (ulong)*(uint *)((long)__s + (long)(int)local_3c * 4));
        }
      }
      fprintf((FILE *)pFile,"End of divisor profile printout\n");
      if (__s != (void *)0x0) {
        free(__s);
      }
      return;
    }
    for (pFStack_20 = p->pTable[(int)local_3c].pHead; pFStack_20 != (Fxu_Double *)0x0;
        pFStack_20 = pFStack_20->pNext) {
      if (iVar1 < pFStack_20->Weight) {
        __assert_fail("pDiv->Weight <= WeightMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPrint.c"
                      ,0xb0,"void Fxu_MatrixPrintDivisorProfile(FILE *, Fxu_Matrix *)");
      }
      if (pFStack_20->Weight == -1) {
        i = i + 1;
      }
      else if (pFStack_20->Weight < 0) {
        local_38 = local_38 + 1;
      }
      else {
        *(int *)((long)__s + (long)pFStack_20->Weight * 4) =
             *(int *)((long)__s + (long)pFStack_20->Weight * 4) + 1;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void Fxu_MatrixPrintDivisorProfile( FILE * pFile, Fxu_Matrix * p )
{
    Fxu_Double * pDiv;
    int WeightMax;
    int * pProfile;
    int Counter1; // the number of -1 weight
    int CounterL; // the number of less than -1 weight
    int i;

    WeightMax = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );
    pProfile = ABC_ALLOC( int, (WeightMax + 1) );
    memset( pProfile, 0, sizeof(int) * (WeightMax + 1) );

    Counter1 = 0;
    CounterL = 0;
	Fxu_MatrixForEachDouble( p, pDiv, i )
    {
        assert( pDiv->Weight <= WeightMax );
        if ( pDiv->Weight == -1 )
            Counter1++;
        else if ( pDiv->Weight < 0 )
            CounterL++;
        else
            pProfile[ pDiv->Weight ]++;
    }

	fprintf( pFile, "The double divisors profile:\n" );
	fprintf( pFile, "Weight  < -1 divisors = %6d\n", CounterL );
	fprintf( pFile, "Weight    -1 divisors = %6d\n", Counter1 );
    for ( i = 0; i <= WeightMax; i++ )
        if ( pProfile[i] )
	        fprintf( pFile, "Weight   %3d divisors = %6d\n", i, pProfile[i] );
	fprintf( pFile, "End of divisor profile printout\n" );
    ABC_FREE( pProfile );
}